

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Trainer::Node::Node(Node *this,int actionNum)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  this->mActionNum = (uint8_t)actionNum;
  this->mAlreadyCalculated = false;
  this->mNeedToUpdateStrategy = false;
  uVar5 = 0;
  uVar6 = 0xffffffffffffffff;
  if (-1 < actionNum) {
    uVar6 = (ulong)(uint)actionNum << 3;
  }
  uVar7 = 0;
  if (0 < actionNum) {
    uVar7 = (ulong)(uint)actionNum;
  }
  pdVar1 = (double *)operator_new__(uVar6);
  this->mRegretSum = pdVar1;
  pdVar2 = (double *)operator_new__(uVar6);
  this->mStrategy = pdVar2;
  pdVar3 = (double *)operator_new__(uVar6);
  this->mStrategySum = pdVar3;
  pdVar4 = (double *)operator_new__(uVar6);
  this->mAverageStrategy = pdVar4;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pdVar1[uVar5] = 0.0;
    pdVar2[uVar5] = 1.0 / (double)actionNum;
    pdVar3[uVar5] = 0.0;
    pdVar4[uVar5] = 0.0;
  }
  return;
}

Assistant:

Node::Node(const int actionNum) : mActionNum(actionNum), mAlreadyCalculated(false), mNeedToUpdateStrategy(false) {
    mRegretSum = new double[actionNum];
    mStrategy = new double[actionNum];
    mStrategySum = new double[actionNum];
    mAverageStrategy = new double[actionNum];
    for (int a = 0; a < actionNum; ++a) {
        mRegretSum[a] = 0.0;
        mStrategy[a] = 1.0 / (double) actionNum;
        mStrategySum[a] = 0.0;
        mAverageStrategy[a] = 0.0;
    }
}